

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

void __thiscall CVmObjStringBuffer::apply_undo(CVmObjStringBuffer *this,CVmUndoRecord *undo_rec)

{
  vm_obj_id_t self;
  int iVar1;
  int *__ptr;
  
  __ptr = (int *)(undo_rec->id).ptrval;
  if (__ptr != (int *)0x0) {
    self = undo_rec->obj;
    iVar1 = *__ptr;
    if (iVar1 == 2) {
      splice_text(this,self,__ptr[1],__ptr[3],__ptr + 4,__ptr[2],0);
    }
    else if (iVar1 == 1) {
      insert_text(this,self,__ptr[1],__ptr + 4,__ptr[2],0);
    }
    else if (iVar1 == 0) {
      delete_text(this,self,__ptr[1],__ptr[3],0);
    }
    free(__ptr);
    (undo_rec->id).ptrval = (void *)0x0;
  }
  return;
}

Assistant:

void CVmObjStringBuffer::apply_undo(VMG_ struct CVmUndoRecord *undo_rec)
{
    if (undo_rec->id.ptrval != 0)
    {
        strbuf_undo_rec *rec;
        vm_obj_id_t self = undo_rec->obj;

        /* get our private record from the standard undo record */
        rec = (strbuf_undo_rec *)undo_rec->id.ptrval;

        /* check the action in the record */
        switch(rec->action)
        {
        case STRBUF_UNDO_INS:
            /* we inserted text into the buffer; delete the new text */
            delete_text(vmg_ self, rec->idx, rec->new_len, FALSE);
            break;

        case STRBUF_UNDO_DEL:
            /* we deleted text; re-insert the old text */
            insert_text(vmg_ self, rec->idx, rec->str, rec->old_len, FALSE);
            break;

        case STRBUF_UNDO_REPL:
            /* we replaced text; splice the old text in place of the new */
            splice_text(vmg_ self,
                        rec->idx, rec->new_len, rec->str, rec->old_len,
                        FALSE);
            break;
        }

        /* discard the private record */
        t3free(rec);

        /* clear the pointer in the main record so we know it's gone */
        undo_rec->id.ptrval = 0;
    }
}